

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doc_comment.cc
# Opt level: O2

void google::protobuf::compiler::java::WriteFieldStringBytesAccessorDocComment
               (Printer *printer,FieldDescriptor *field,FieldAccessorType type,Options *options,
               bool builder,bool kdoc)

{
  char *pcVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1;
  string_view text;
  string_view text_00;
  string_view text_01;
  string_view text_02;
  string_view text_03;
  string_view text_04;
  size_t sStack_130;
  Options local_120;
  Options local_d0;
  Options local_80;
  
  text._M_str = "/**\n";
  text._M_len = 4;
  io::Printer::Print<>(printer,text);
  Options::Options(&local_80,options);
  WriteDocCommentBody<google::protobuf::FieldDescriptor>(printer,field,&local_80,kdoc);
  Options::~Options(&local_80);
  Options::Options(&local_d0,options);
  WriteDebugString(printer,field,&local_d0,kdoc);
  Options::~Options(&local_d0);
  if (!kdoc) {
    Options::Options(&local_120,options);
    WriteDeprecatedJavadoc(printer,field,type,&local_120);
    Options::~Options(&local_120);
  }
  switch(type) {
  case GETTER:
    args_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((ulong)(((byte)field[3] & 0xc) << 3) + *(long *)(field + 8));
    pcVar1 = " * @return The bytes for $name$.\n";
    sStack_130 = 0x21;
    break;
  case SETTER:
    args_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((ulong)(((byte)field[3] & 0xc) << 3) + *(long *)(field + 8));
    pcVar1 = " * @param value The bytes for $name$ to set.\n";
    sStack_130 = 0x2d;
    break;
  default:
    goto switchD_001ff59f_caseD_3;
  case LIST_GETTER:
    args_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((ulong)(((byte)field[3] & 0xc) << 3) + *(long *)(field + 8));
    pcVar1 = " * @return A list containing the bytes for $name$.\n";
    sStack_130 = 0x33;
    break;
  case LIST_INDEXED_GETTER:
    text_00._M_str = " * @param index The index of the value to return.\n";
    text_00._M_len = 0x32;
    io::Printer::Print<>(printer,text_00);
    args_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((ulong)(((byte)field[3] & 0xc) << 3) + *(long *)(field + 8));
    pcVar1 = " * @return The bytes of the $name$ at the given index.\n";
    sStack_130 = 0x37;
    break;
  case LIST_INDEXED_SETTER:
    text_01._M_str = " * @param index The index to set the value at.\n";
    text_01._M_len = 0x2f;
    io::Printer::Print<>(printer,text_01);
    args_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((ulong)(((byte)field[3] & 0xc) << 3) + *(long *)(field + 8));
    pcVar1 = " * @param value The bytes of the $name$ to set.\n";
    goto LAB_001ff6b2;
  case LIST_ADDER:
    args_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((ulong)(((byte)field[3] & 0xc) << 3) + *(long *)(field + 8));
    pcVar1 = " * @param value The bytes of the $name$ to add.\n";
LAB_001ff6b2:
    sStack_130 = 0x30;
    break;
  case LIST_MULTI_ADDER:
    args_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((ulong)(((byte)field[3] & 0xc) << 3) + *(long *)(field + 8));
    pcVar1 = " * @param values The bytes of the $name$ to add.\n";
    sStack_130 = 0x31;
  }
  text_02._M_str = pcVar1;
  text_02._M_len = sStack_130;
  io::Printer::Print<char[5],std::__cxx11::string>(printer,text_02,(char (*) [5])0x3f02df,args_1);
switchD_001ff59f_caseD_3:
  if (builder) {
    text_03._M_str = " * @return This builder for chaining.\n";
    text_03._M_len = 0x26;
    io::Printer::Print<>(printer,text_03);
  }
  text_04._M_str = " */\n";
  text_04._M_len = 4;
  io::Printer::Print<>(printer,text_04);
  return;
}

Assistant:

void WriteFieldStringBytesAccessorDocComment(io::Printer* printer,
                                             const FieldDescriptor* field,
                                             const FieldAccessorType type,
                                             const Options options,
                                             const bool builder,
                                             const bool kdoc) {
  printer->Print("/**\n");
  WriteDocCommentBody(printer, field, options, kdoc);
  WriteDebugString(printer, field, options, kdoc);
  if (!kdoc) WriteDeprecatedJavadoc(printer, field, type, options);
  switch (type) {
    case HAZZER:
      // Should never happen
      break;
    case GETTER:
      printer->Print(" * @return The bytes for $name$.\n", "name",
                     field->camelcase_name());
      break;
    case SETTER:
      printer->Print(" * @param value The bytes for $name$ to set.\n", "name",
                     field->camelcase_name());
      break;
    case CLEARER:
      // Print nothing
      break;
    // Repeated
    case LIST_COUNT:
      // Should never happen
      break;
    case LIST_GETTER:
      printer->Print(" * @return A list containing the bytes for $name$.\n",
                     "name", field->camelcase_name());
      break;
    case LIST_INDEXED_GETTER:
      printer->Print(" * @param index The index of the value to return.\n");
      printer->Print(" * @return The bytes of the $name$ at the given index.\n",
                     "name", field->camelcase_name());
      break;
    case LIST_INDEXED_SETTER:
      printer->Print(" * @param index The index to set the value at.\n");
      printer->Print(" * @param value The bytes of the $name$ to set.\n",
                     "name", field->camelcase_name());
      break;
    case LIST_ADDER:
      printer->Print(" * @param value The bytes of the $name$ to add.\n",
                     "name", field->camelcase_name());
      break;
    case LIST_MULTI_ADDER:
      printer->Print(" * @param values The bytes of the $name$ to add.\n",
                     "name", field->camelcase_name());
      break;
  }
  if (builder) {
    printer->Print(" * @return This builder for chaining.\n");
  }
  printer->Print(" */\n");
}